

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unwind.c
# Opt level: O2

LispPTR * N_OP_unwind(LispPTR *cstkptr,LispPTR tos,int n,int keep)

{
  uint uVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  int iVar4;
  undefined4 *puVar5;
  
  pLVar3 = (LispPTR *)(MachineState.pvar + (long)n * 2);
  if (cstkptr < pLVar3) {
    MachineState.csp = (DLword *)cstkptr;
    MachineState.tosvalue = tos;
    MachineState.errorexit = 1;
    return (LispPTR *)0xffffffffffffffff;
  }
  *cstkptr = tos;
  pLVar2 = cstkptr + 1;
  while (pLVar3 < pLVar2) {
    uVar1 = pLVar2[-1];
    pLVar2 = pLVar2 + -1;
    if ((int)uVar1 < 0) {
      puVar5 = (undefined4 *)((ulong)((uVar1 & 0xffff) * 2) + (long)MachineState.pvar);
      for (iVar4 = -((int)uVar1 >> 0x10); 1 < iVar4; iVar4 = iVar4 + -1) {
        *puVar5 = 0xffffffff;
        puVar5 = puVar5 + -1;
      }
    }
  }
  if (keep != 0) {
    *pLVar2 = tos;
    pLVar2 = pLVar2 + 1;
  }
  return pLVar2;
}

Assistant:

LispPTR *N_OP_unwind(LispPTR *cstkptr, LispPTR tos, int n, int keep) {
  int num;           /* number of UNBOUND slot */
  LispPTR *endptr;   /* unwind limit */
  LispPTR *lastpvar; /* points PVar slot that is unbounded. */

  /* Slots:
          -----------------
          |		|	<- PVar
          -----------------
          |	.	|
          |	.	|
          -----------------
          |		|	 ALL OF THE FOLLOWING LOCATIONS SCANNED:
          -----------------------------------------------------------------
          | tos if keep	|	<- endptr (PVar[n]) <- Result (no keep)	|
          -----------------						|
          |		|	<- Result (keep)			|
          -----------------						|
          |		|						|
          -----------------						|
          |	.	|						|
          |	.	|						|
          -----------------						|
          |   tos pushed	|	<- Start CSTKPTR			|
          -----------------------------------------------------------------
          |		|	<- CSTKPTR temporarily bumped pushing tos
          -----------------

          NOTE: upon return the emulator does a POP to get the new tos value

  */

  endptr = (LispPTR *)PVar + n; /* set unwind limit */

  if (endptr > cstkptr) {
    CurrentStackPTR = (DLword *)cstkptr;
    /* this would be ERROR_EXIT(tos); but for having to return a pointer */
    TopOfStack = tos;
    Error_Exit = 1;
    return (LispPTR *)(-1);
  }
  *cstkptr++ = tos;

  /* UNBOUND MARK loop  */

  while (cstkptr > endptr) {
    /* Look for the Next BIND marker */

    if ((num = (int)*--cstkptr) < 0) {
      /* Now UNBIND the PVARS indicated by the BIND marker */

      lastpvar = (LispPTR *)(2 + PVar + (unsigned short)num);
      num = ~(num >> 16) + 1;
      for (; --num > 0;) { *--lastpvar = 0xffffffff; /* Mark as UNBOUND */ }
    }
  }

  /* endptr = cstkptr */

  if (keep) { *(cstkptr++) = tos; }
  return (cstkptr);

}